

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O2

bool __thiscall
arangodb::velocypack::Builder::checkAttributeUniquenessSorted(Builder *this,Slice obj)

{
  int iVar1;
  uint8_t *__s1;
  Slice SVar2;
  long lVar3;
  size_t __n;
  ValueLength len;
  Slice previous;
  ObjectIterator it;
  
  ObjectIterator::ObjectIterator(&it,obj,false);
  previous = ObjectIterator::key(&it,true);
  __s1 = (uint8_t *)
         SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getString
                   ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&previous
                    ,&len);
  ObjectIterator::next(&it);
  while( true ) {
    SVar2 = ObjectIterator::key(&it,true);
    if ((byte)(*SVar2._start - 0x40) < 0x7f) {
      __n = (size_t)(*SVar2._start - 0x40);
      lVar3 = 1;
    }
    else {
      __n = *(size_t *)(SVar2._start + 1);
      lVar3 = 9;
    }
    if ((len == __n) && (iVar1 = bcmp(__s1,SVar2._start + lVar3,__n), iVar1 == 0)) break;
    len = __n;
    ObjectIterator::next(&it);
    __s1 = SVar2._start + lVar3;
    if (it._position == it._size) {
      return true;
    }
  }
  return false;
}

Assistant:

bool Builder::checkAttributeUniquenessSorted(Slice obj) const {
  ObjectIterator it(obj, false);

  // fetch initial key
  Slice previous = it.key(true);
  ValueLength len;
  char const* p = previous.getString(len);

  // advance to next key already
  it.next();

  do {
    Slice const current = it.key(true);
    VELOCYPACK_ASSERT(current.isString());

    ValueLength len2;
    char const* q = current.getStringUnchecked(len2);

    if (len == len2 && std::memcmp(p, q, checkOverflow(len2)) == 0) {
      // identical key
      return false;
    }
    // re-use already calculated values for next round
    len = len2;
    p = q;
    it.next();
  } while (it.valid());

  // all keys unique
  return true;
}